

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O2

int __thiscall
Storage::Tape::Oric::Parser::get_next_byte
          (Parser *this,shared_ptr<Storage::Tape::Tape> *tape,bool use_fast_encoding)

{
  int iVar1;
  SymbolType SVar2;
  uint uVar3;
  int iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  
  this->detection_mode_ = (DetectionMode)CONCAT71(in_register_00000011,use_fast_encoding) ^ SlowZero
  ;
  this->cycle_length_ = 0.0;
  uVar5 = 0;
  iVar1 = 0;
  while (iVar4 = iVar1, iVar4 < 0xb) {
    iVar1 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
               ->_vptr_Tape)();
    if ((char)iVar1 != '\0') break;
    SVar2 = Parser<Storage::Tape::Oric::SymbolType>::get_next_symbol
                      ((Parser<Storage::Tape::Oric::SymbolType> *)this,tape);
    if ((iVar4 != 0) || (iVar1 = 0, SVar2 == Zero)) {
      this->detection_mode_ = (uint)!use_fast_encoding;
      uVar5 = uVar5 | (uint)(SVar2 == One) << ((byte)iVar4 & 0x1f);
      iVar1 = iVar4 + 1;
    }
  }
  iVar1 = (**((tape->super___shared_ptr<Storage::Tape::Tape,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
             _vptr_Tape)();
  uVar3 = 0xffffffff;
  if ((char)iVar1 == '\0') {
    uVar3 = uVar5 >> 1 & 0xff;
  }
  return uVar3;
}

Assistant:

int Parser::get_next_byte(const std::shared_ptr<Storage::Tape::Tape> &tape, bool use_fast_encoding) {
	detection_mode_ = use_fast_encoding ? FastZero : SlowZero;
	cycle_length_ = 0.0f;

	int result = 0;
	int bit_count = 0;
	while(bit_count < 11 && !tape->is_at_end()) {
		SymbolType symbol = get_next_symbol(tape);
		if(!bit_count && symbol != SymbolType::Zero) continue;
		detection_mode_ = use_fast_encoding ? FastData : SlowData;
		result |= ((symbol == SymbolType::One) ? 1 : 0) << bit_count;
		bit_count++;
	}
	// TODO: check parity?
	return tape->is_at_end() ? -1 : ((result >> 1)&0xff);
}